

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O2

string * chapter2::max(string *__return_storage_ptr__,string *t1,string *t2)

{
  bool bVar1;
  
  bVar1 = std::operator>(t1,t2);
  if (bVar1) {
    t2 = t1;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)t2);
  return __return_storage_ptr__;
}

Assistant:

string max(string &t1, string &t2) {
        return t1 > t2 ? t1 : t2;
    }